

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles2::Functional::evalSequenceNoSideEffCase3(ShaderEvalContext *ctx)

{
  tcu local_7c [4];
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  Vector<float,_4> local_48;
  Vector<int,_4> local_38;
  Vector<int,_4> local_28;
  
  fStack_4c = ctx->in[1].m_data[0];
  fStack_50 = ctx->in[1].m_data[1];
  fStack_54 = ctx->in[1].m_data[2];
  local_58 = ctx->in[1].m_data[3];
  tcu::Vector<float,_4>::cast<int>(&local_48);
  local_68.m_data[0] = ctx->in[2].m_data[0];
  local_68.m_data[3] = ctx->in[2].m_data[1];
  local_68.m_data[2] = ctx->in[2].m_data[2];
  local_68.m_data[1] = ctx->in[2].m_data[3];
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 0.0;
  tcu::greaterThan<float,4>(local_7c,&local_68,&local_78);
  tcu::Vector<int,_4>::Vector(&local_38,(Vector<int,_4> *)&local_48);
  tcu::Vector<int,_4>::cast<float>(&local_28);
  *(undefined8 *)(ctx->color).m_data = local_28.m_data._0_8_;
  *(undefined8 *)((ctx->color).m_data + 2) = local_28.m_data._8_8_;
  return;
}

Assistant:

void evalSequenceNoSideEffCase3	(ShaderEvalContext& ctx) { ctx.color		= sequenceNoSideEffCase3(ctx.in[0].swizzle(1, 2, 3, 0), ctx.in[1].swizzle(3, 2, 1, 0).asInt(), greaterThan(ctx.in[2].swizzle(0, 3, 2, 1), Vec4(0.0f, 0.0f, 0.0f, 0.0f))).asFloat(); }